

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int wally_base64_from_bytes(uchar *bytes,size_t bytes_len,uint32_t flags,char **output)

{
  size_t sVar1;
  char *dest;
  ssize_t sVar2;
  size_t encoded_len;
  char *encoded;
  char **output_local;
  uint32_t flags_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if ((((bytes == (uchar *)0x0) || (bytes_len == 0)) || (flags != 0)) || (output == (char **)0x0)) {
    bytes_local._4_4_ = -2;
  }
  else {
    sVar1 = base64_encoded_length(bytes_len);
    sVar1 = sVar1 + 1;
    dest = (char *)wally_malloc(sVar1);
    if (dest == (char *)0x0) {
      bytes_local._4_4_ = -3;
    }
    else {
      sVar2 = base64_encode(dest,sVar1,(char *)bytes,bytes_len);
      if (sVar2 < 0) {
        clear_and_free(dest,sVar1);
        bytes_local._4_4_ = -2;
      }
      else {
        *output = dest;
        bytes_local._4_4_ = 0;
      }
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_base64_from_bytes(const unsigned char *bytes, size_t bytes_len,
                            uint32_t flags, char **output)
{
    char *encoded;
    size_t encoded_len;

    if (output)
        *output = NULL;

    if (!bytes || !bytes_len || flags || !output)
        return WALLY_EINVAL;

    encoded_len = base64_encoded_length(bytes_len) + 1; /* +1 for NUL */
    if ((encoded = wally_malloc(encoded_len)) == NULL)
        return WALLY_ENOMEM;

    if (base64_encode(encoded, encoded_len, (const char *)bytes, bytes_len) < 0) {
        clear_and_free(encoded, encoded_len);
        return WALLY_EINVAL;
    }
    *output = encoded;
    return WALLY_OK;
}